

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_pop(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int shift)

{
  JSValueUnion *__dest;
  int iVar1;
  JSValueUnion JVar2;
  uint uVar3;
  int64_t iVar4;
  void *pvVar5;
  JSRefCountHeader *p_3;
  JSValueUnion JVar6;
  JSRefCountHeader *p;
  uint uVar7;
  JSValueUnion idx;
  JSValue obj;
  JSValue v;
  JSValue JVar8;
  int64_t len;
  ulong local_38;
  
  obj = JS_ToObject(ctx,this_val);
  JVar2 = obj.u;
  iVar1 = js_get_length64(ctx,(int64_t *)&local_38,obj);
  uVar7 = (uint)obj.tag;
  if (iVar1 == 0) {
    if ((long)local_38 < 1) {
      v = (JSValue)(ZEXT816(3) << 0x40);
      idx.float64 = 0.0;
LAB_00142d30:
      iVar4 = 0;
LAB_00142d33:
      JVar8.tag = iVar4;
      JVar8.u.float64 = idx.float64;
      iVar1 = JS_SetPropertyInternal(ctx,obj,0x30,JVar8,0x4000);
      if (-1 < iVar1) {
        if (uVar7 < 0xfffffff5) {
          return v;
        }
        iVar1 = *JVar2.ptr;
        *(int *)JVar2.ptr = iVar1 + -1;
        JVar8 = v;
        goto joined_r0x00142d67;
      }
    }
    else {
      idx.ptr = (void *)(local_38 - 1);
      if ((((uVar7 == 0xffffffff) && (*(short *)((long)JVar2.ptr + 6) == 2)) &&
          ((*(byte *)((long)JVar2.ptr + 5) & 8) != 0)) &&
         (uVar3 = *(uint *)((long)JVar2.ptr + 0x40), local_38 == uVar3)) {
        __dest = *(JSValueUnion **)((long)JVar2.ptr + 0x38);
        if (shift == 0) {
          uVar3 = uVar3 - 1;
          JVar6 = (JSValueUnion)__dest[(ulong)uVar3 * 2].ptr;
          pvVar5 = __dest[(ulong)uVar3 * 2 + 1].ptr;
        }
        else {
          JVar6 = (JSValueUnion)__dest->ptr;
          pvVar5 = __dest[1].ptr;
          memmove(__dest,__dest + 2,(ulong)(uVar3 - 1) << 4);
          uVar3 = *(int *)((long)JVar2.ptr + 0x40) - 1;
        }
        v.tag = (int64_t)pvVar5;
        v.u.float64 = JVar6.float64;
        *(uint *)((long)JVar2.ptr + 0x40) = uVar3;
LAB_00142de8:
        if (local_38 < 0x80000001) goto LAB_00142d30;
        idx.float64 = (double)(long)idx.ptr;
        iVar4 = 7;
        goto LAB_00142d33;
      }
      if (shift == 0) {
        v = JS_GetPropertyInt64(ctx,obj,(int64_t)idx);
        if ((int)v.tag != 6) goto LAB_00142d83;
      }
      else {
        v = JS_GetPropertyValue(ctx,obj,(JSValue)ZEXT816(0));
        if (((int)v.tag != 6) && (iVar1 = JS_CopySubArray(ctx,obj,0,1,(int64_t)idx,1), iVar1 == 0))
        {
LAB_00142d83:
          iVar1 = JS_DeletePropertyInt64(ctx,obj,(int64_t)idx,0x4000);
          if (-1 < iVar1) goto LAB_00142de8;
        }
      }
    }
    if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  if (uVar7 < 0xfffffff5) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar1 = *JVar2.ptr;
  *(int *)JVar2.ptr = iVar1 + -1;
  JVar8 = (JSValue)(ZEXT816(6) << 0x40);
  v = (JSValue)(ZEXT816(6) << 0x40);
joined_r0x00142d67:
  if (iVar1 < 2) {
    __JS_FreeValueRT(ctx->rt,obj);
    v = JVar8;
  }
  return v;
}

Assistant:

static JSValue js_array_pop(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv, int shift)
{
    JSValue obj, res = JS_UNDEFINED;
    int64_t len, newLen;
    JSValue *arrp;
    uint32_t count32;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;
    newLen = 0;
    if (len > 0) {
        newLen = len - 1;
        /* Special case fast arrays */
        if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            if (shift) {
                res = arrp[0];
                memmove(arrp, arrp + 1, (count32 - 1) * sizeof(*arrp));
                p->u.array.count--;
            } else {
                res = arrp[count32 - 1];
                p->u.array.count--;
            }
        } else {
            if (shift) {
                res = JS_GetPropertyInt64(ctx, obj, 0);
                if (JS_IsException(res))
                    goto exception;
                if (JS_CopySubArray(ctx, obj, 0, 1, len - 1, +1))
                    goto exception;
            } else {
                res = JS_GetPropertyInt64(ctx, obj, newLen);
                if (JS_IsException(res))
                    goto exception;
            }
            if (JS_DeletePropertyInt64(ctx, obj, newLen, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, obj, JS_ATOM_length, JS_NewInt64(ctx, newLen)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return res;

 exception:
    JS_FreeValue(ctx, res);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}